

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void nn_hash_insert(nn_hash *self,uint32_t key,nn_hash_item *item)

{
  nn_list *pnVar1;
  uint32_t uVar2;
  nn_list_item *pnVar3;
  uint uVar4;
  bool bVar5;
  nn_list_item **local_40;
  nn_list_item *pnStack_28;
  uint32_t i;
  nn_list_item *it;
  nn_hash_item *item_local;
  uint32_t key_local;
  nn_hash *self_local;
  
  uVar2 = nn_hash_key(key);
  uVar4 = uVar2 % self->slots;
  pnStack_28 = nn_list_begin(self->array + uVar4);
  while( true ) {
    pnVar3 = nn_list_end(self->array + uVar4);
    if (pnStack_28 == pnVar3) {
      item->key = key;
      pnVar1 = self->array;
      pnVar3 = nn_list_end(self->array + uVar4);
      nn_list_insert(pnVar1 + uVar4,&item->list,pnVar3);
      self->items = self->items + 1;
      bVar5 = false;
      if (self->slots < self->items << 1) {
        bVar5 = self->slots < 0x80000000;
      }
      if (bVar5) {
        nn_hash_rehash(self);
      }
      return;
    }
    if (pnStack_28 == (nn_list_item *)0x0) {
      local_40 = (nn_list_item **)0x0;
    }
    else {
      local_40 = &pnStack_28[-1].prev;
    }
    if (*(uint32_t *)local_40 == key) break;
    pnStack_28 = nn_list_next(self->array + uVar4,pnStack_28);
  }
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
          "nn_cont (it, struct nn_hash_item, list)->key != key",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/../src/utils/hash.c"
          ,0x65);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

void nn_hash_insert (struct nn_hash *self, uint32_t key,
    struct nn_hash_item *item)
{
    struct nn_list_item *it;
    uint32_t i;

    i = nn_hash_key (key) % self->slots;

    for (it = nn_list_begin (&self->array [i]);
          it != nn_list_end (&self->array [i]);
          it = nn_list_next (&self->array [i], it))
        nn_assert (nn_cont (it, struct nn_hash_item, list)->key != key);

    item->key = key;
    nn_list_insert (&self->array [i], &item->list,
        nn_list_end (&self->array [i]));
    ++self->items;

    /*  If the hash is getting full, double the amount of slots and
        re-hash all the items. */
    if (nn_slow (self->items * 2 > self->slots && self->slots < 0x80000000))
    nn_hash_rehash(self);
}